

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

void __thiscall
Assimp::MD3Importer::ConvertPath(MD3Importer *this,char *texture_name,char *header_name,string *out)

{
  int iVar1;
  unsigned_long *puVar2;
  unsigned_long local_50;
  unsigned_long local_48;
  size_t len1;
  size_t len2;
  char *end2;
  char *end1;
  string *out_local;
  char *header_name_local;
  char *texture_name_local;
  MD3Importer *this_local;
  
  end1 = (char *)out;
  out_local = (string *)header_name;
  header_name_local = texture_name;
  texture_name_local = (char *)this;
  end2 = strrchr(header_name,0x5c);
  if (end2 == (char *)0x0) {
    end2 = strrchr((char *)out_local,0x2f);
  }
  len2 = (size_t)strrchr(header_name_local,0x5c);
  if ((char *)len2 == (char *)0x0) {
    len2 = (size_t)strrchr(header_name_local,0x2f);
  }
  if (len2 != 0) {
    local_48 = (long)end2 - (long)out_local;
    iVar1 = ASSIMP_strincmp(header_name_local,"models",6);
    if ((iVar1 == 0) && ((header_name_local[6] == '/' || (header_name_local[6] == '\\')))) {
      len1 = 6;
      if (out_local->_M_dataplus == (_Alloc_hider)0x0) {
        std::__cxx11::string::operator=((string *)end1,(char *)(len2 + 1));
        return;
      }
    }
    else {
      local_50 = len2 - (long)header_name_local;
      puVar2 = std::min<unsigned_long>(&local_48,&local_50);
      len1 = *puVar2;
    }
    iVar1 = ASSIMP_strincmp(header_name_local,(char *)out_local,(uint)len1);
    if (iVar1 == 0) {
      std::__cxx11::string::operator=((string *)end1,(char *)(len2 + 1));
      return;
    }
  }
  std::__cxx11::string::operator=((string *)end1,header_name_local);
  return;
}

Assistant:

void MD3Importer::ConvertPath(const char* texture_name, const char* header_name, std::string& out) const
{
    // If the MD3's internal path itself and the given path are using
    // the same directory, remove it completely to get right output paths.
    const char* end1 = ::strrchr(header_name,'\\');
    if (!end1)end1   = ::strrchr(header_name,'/');

    const char* end2 = ::strrchr(texture_name,'\\');
    if (!end2)end2   = ::strrchr(texture_name,'/');

    // HACK: If the paths starts with "models", ignore the
    // next two hierarchy levels, it specifies just the model name.
    // Ignored by Q3, it might be not equal to the real model location.
    if (end2)   {

        size_t len2;
        const size_t len1 = (size_t)(end1 - header_name);
        if (!ASSIMP_strincmp(texture_name,"models",6) && (texture_name[6] == '/' || texture_name[6] == '\\')) {
            len2 = 6; // ignore the seventh - could be slash or backslash

            if (!header_name[0]) {
                // Use the file name only
                out = end2+1;
                return;
            }
        }
        else len2 = std::min (len1, (size_t)(end2 - texture_name ));
        if (!ASSIMP_strincmp(texture_name,header_name,static_cast<unsigned int>(len2))) {
            // Use the file name only
            out = end2+1;
            return;
        }
    }
    // Use the full path
    out = texture_name;
}